

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

SourceLibrary * __thiscall slang::ast::Symbol::getSourceLibrary(Symbol *this)

{
  SymbolKind SVar1;
  CompilationUnitSymbol *pCVar2;
  InstanceBodySymbol *this_00;
  DefinitionSymbol *pDVar3;
  Scope *this_01;
  Symbol *in_RDI;
  Scope *scope;
  Symbol *curr;
  Symbol *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    SVar1 = local_18->kind;
    if (SVar1 == Definition) {
      pDVar3 = as<slang::ast::DefinitionSymbol>((Symbol *)0xa24400);
      return pDVar3->sourceLibrary;
    }
    if (SVar1 == CompilationUnit) {
      pCVar2 = as<slang::ast::CompilationUnitSymbol>((Symbol *)0xa2441b);
      return pCVar2->sourceLibrary;
    }
    if (SVar1 == Instance) {
      as<slang::ast::InstanceSymbol>((Symbol *)0xa24453);
      pDVar3 = InstanceSymbol::getDefinition((InstanceSymbol *)0xa2445b);
      return pDVar3->sourceLibrary;
    }
    if (SVar1 == InstanceBody) break;
    this_01 = getParentScope(local_18);
    if (this_01 == (Scope *)0x0) {
      return (SourceLibrary *)0x0;
    }
    local_18 = Scope::asSymbol(this_01);
  }
  this_00 = as<slang::ast::InstanceBodySymbol>((Symbol *)0xa24433);
  pDVar3 = InstanceBodySymbol::getDefinition(this_00);
  return pDVar3->sourceLibrary;
}

Assistant:

const SourceLibrary* Symbol::getSourceLibrary() const {
    auto curr = this;
    while (true) {
        switch (curr->kind) {
            case SymbolKind::Definition:
                return &curr->as<DefinitionSymbol>().sourceLibrary;
            case SymbolKind::CompilationUnit:
                return &curr->as<CompilationUnitSymbol>().sourceLibrary;
            case SymbolKind::InstanceBody:
                return &curr->as<InstanceBodySymbol>().getDefinition().sourceLibrary;
            case SymbolKind::Instance:
                return &curr->as<InstanceSymbol>().getDefinition().sourceLibrary;
            default:
                auto scope = curr->getParentScope();
                if (!scope)
                    return nullptr;

                curr = &scope->asSymbol();
                break;
        }
    }
}